

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * exprTableRegister(Parse *pParse,Table *pTab,int regBase,i16 iCol)

{
  sqlite3 *db_00;
  Column *pCVar1;
  sqlite3 *db;
  char *zColl;
  Column *pCol;
  Expr *pExpr;
  i16 iCol_local;
  int regBase_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pCol = (Column *)sqlite3Expr(db_00,0x9d,(char *)0x0);
  if ((Expr *)pCol != (Expr *)0x0) {
    if ((iCol < 0) || (iCol == pTab->iPKey)) {
      ((Expr *)pCol)->iTable = regBase;
      ((Expr *)pCol)->affinity = 'D';
    }
    else {
      pCVar1 = pTab->aCol;
      ((Expr *)pCol)->iTable = regBase + iCol + 1;
      ((Expr *)pCol)->affinity = pCVar1[iCol].affinity;
      db = (sqlite3 *)pCVar1[iCol].zColl;
      if (db == (sqlite3 *)0x0) {
        db = (sqlite3 *)db_00->pDfltColl->zName;
      }
      pCol = (Column *)sqlite3ExprAddCollateString(pParse,(Expr *)pCol,(char *)db);
    }
  }
  return (Expr *)pCol;
}

Assistant:

static Expr *exprTableRegister(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* The table whose content is at r[regBase]... */
  int regBase,       /* Contents of table pTab */
  i16 iCol           /* Which column of pTab is desired */
){
  Expr *pExpr;
  Column *pCol;
  const char *zColl;
  sqlite3 *db = pParse->db;

  pExpr = sqlite3Expr(db, TK_REGISTER, 0);
  if( pExpr ){
    if( iCol>=0 && iCol!=pTab->iPKey ){
      pCol = &pTab->aCol[iCol];
      pExpr->iTable = regBase + iCol + 1;
      pExpr->affinity = pCol->affinity;
      zColl = pCol->zColl;
      if( zColl==0 ) zColl = db->pDfltColl->zName;
      pExpr = sqlite3ExprAddCollateString(pParse, pExpr, zColl);
    }else{
      pExpr->iTable = regBase;
      pExpr->affinity = SQLITE_AFF_INTEGER;
    }
  }
  return pExpr;
}